

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O2

char * xe::stripLeadingWhitespace(char *str)

{
  int iVar1;
  
  iVar1 = 0;
  while( true ) {
    if ((0x20 < (ulong)(byte)str[iVar1]) ||
       ((0x100002600U >> ((ulong)(byte)str[iVar1] & 0x3f) & 1) == 0)) break;
    iVar1 = iVar1 + 1;
  }
  return str + iVar1;
}

Assistant:

static const char* stripLeadingWhitespace (const char* str)
{
	int whitespaceCount = 0;

	while (str[whitespaceCount]	!= 0	&&
		   (str[whitespaceCount] == ' '		||
			str[whitespaceCount] == '\t'	||
			str[whitespaceCount] == '\r'	||
			str[whitespaceCount] == '\n'))
		whitespaceCount += 1;

	return str + whitespaceCount;
}